

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLayout.cpp
# Opt level: O2

void __thiscall SimpleLayout::Layout(SimpleLayout *this)

{
  IRKind IVar1;
  LabelInstr *pLVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  PragmaInstr *pPVar4;
  LabelInstr *nextLabel;
  Instr *pIVar5;
  BranchInstr *pBVar6;
  BranchInstr *pBVar7;
  LabelInstr *labelInstr;
  Instr *pIVar8;
  Instr *pIVar9;
  Func *local_50;
  Instr *local_48;
  uint32 local_34;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,LayoutPhase,sourceContextId,functionId);
  if ((bVar3) ||
     (bVar3 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), bVar3)) {
    return;
  }
  local_48 = this->func->m_tailInstr;
  if (local_48->m_prev == (Instr *)0x0) {
    pIVar9 = (Instr *)0x0;
  }
  else {
    pIVar9 = local_48->m_prev->m_next;
  }
  pIVar8 = this->func->m_headInstr;
  local_50 = (Func *)0x0;
  local_34 = 0xffffffff;
LAB_005b3787:
  do {
    pLVar2 = (LabelInstr *)0x0;
    do {
      do {
        do {
          do {
            do {
              while( true ) {
                while( true ) {
                  pIVar5 = pIVar8;
                  labelInstr = pLVar2;
                  if (pIVar5 == pIVar9) {
                    this->func->m_tailInstr = local_48;
                    return;
                  }
                  pIVar8 = pIVar5->m_next;
                  IVar1 = pIVar5->m_kind;
                  pLVar2 = labelInstr;
                  if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) break;
                  if ((IVar1 == InstrKindPragma) && (pIVar5->m_opcode == StatementBoundary)) {
                    pPVar4 = IR::Instr::AsPragmaInstr(pIVar5);
                    this->currentStatement = pPVar4;
                  }
                }
                nextLabel = IR::Instr::AsLabelInstr(pIVar5);
                if ((nextLabel->field_0x78 & 2) == 0) break;
                if (labelInstr == (LabelInstr *)0x0) {
                  pPVar4 = this->currentStatement;
                  local_50 = (Func *)0x0;
                  local_34 = 0xffffffff;
                  pLVar2 = nextLabel;
                  if (pPVar4 != (PragmaInstr *)0x0) {
                    local_34 = pPVar4->m_statementIndex;
                    local_50 = (pPVar4->super_Instr).m_func;
                  }
                }
              }
              pLVar2 = (LabelInstr *)0x0;
            } while (labelInstr == (LabelInstr *)0x0);
            pIVar5 = IR::Instr::GetPrevRealInstrOrLabel(&labelInstr->super_Instr);
            pLVar2 = (LabelInstr *)0x0;
          } while (pIVar5->m_kind != InstrKindBranch);
          pBVar6 = IR::Instr::AsBranchInstr(pIVar5);
          if (pBVar6->m_branchTarget == nextLabel) {
            local_48 = MoveHelperBlock(this,&labelInstr->super_Instr,local_34,local_50,nextLabel,
                                       local_48);
            bVar3 = IR::BranchInstr::IsUnconditional(pBVar6);
            if (bVar3) {
LAB_005b3932:
              IR::Instr::Remove(&pBVar6->super_Instr);
            }
            else {
              LowererMD::InvertBranch(pBVar6);
              IR::BranchInstr::SetTarget(pBVar6,labelInstr);
            }
            goto LAB_005b3787;
          }
          bVar3 = IR::BranchInstr::IsUnconditional(pBVar6);
          pLVar2 = (LabelInstr *)0x0;
        } while (!bVar3);
        pIVar5 = IR::Instr::GetPrevRealInstrOrLabel(pIVar5);
        if (pIVar5->m_kind == InstrKindBranch) {
          pBVar7 = IR::Instr::AsBranchInstr(pIVar5);
          bVar3 = IR::BranchInstr::IsConditional(pBVar7);
          if ((bVar3) &&
             (pBVar7 = IR::Instr::AsBranchInstr(pIVar5), pBVar7->m_branchTarget == nextLabel)) {
            local_48 = MoveHelperBlock(this,&labelInstr->super_Instr,local_34,local_50,nextLabel,
                                       local_48);
            pBVar7 = IR::Instr::AsBranchInstr(pIVar5);
            LowererMD::InvertBranch(pBVar7);
            pBVar7 = IR::Instr::AsBranchInstr(pIVar5);
            IR::BranchInstr::SetTarget(pBVar7,pBVar6->m_branchTarget);
            goto LAB_005b3932;
          }
        }
        pIVar5 = IR::Instr::GetPrevRealInstr(&nextLabel->super_Instr);
        pLVar2 = (LabelInstr *)0x0;
      } while (pIVar5->m_kind != InstrKindBranch);
      pBVar6 = IR::Instr::AsBranchInstr(pIVar5);
      local_48 = MoveHelperBlock(this,&labelInstr->super_Instr,local_34,local_50,nextLabel,local_48)
      ;
      bVar3 = IR::BranchInstr::IsUnconditional(pBVar6);
      pLVar2 = (LabelInstr *)0x0;
    } while (bVar3);
    pBVar7 = IR::BranchInstr::New(JMP,nextLabel,this->func);
    IR::Instr::InsertAfter(&pBVar6->super_Instr,&pBVar7->super_Instr);
  } while( true );
}

Assistant:

void
SimpleLayout::Layout()
{
    if (PHASE_OFF(Js::LayoutPhase, this->func) || CONFIG_ISENABLED(Js::DebugFlag))
    {
        return;
    }

    // Do simple layout of helper block.  Push them to after FunctionExit.

    IR::Instr * lastInstr = func->m_tailInstr;
    IR::LabelInstr * lastOpHelperLabel = NULL;
    uint32 lastOpHelperStatementIndex = Js::Constants::NoStatementIndex;
    Func* lastOpHelperFunc = nullptr;
    FOREACH_INSTR_EDITING_IN_RANGE(instr, instrNext, func->m_headInstr, func->m_tailInstr->m_prev)
    {
        if (instr->IsPragmaInstr() && instr->m_opcode == Js::OpCode::StatementBoundary)
        {
            currentStatement = instr->AsPragmaInstr();
        }
        else if (instr->IsLabelInstr())
        {
            IR::LabelInstr * labelInstr = instr->AsLabelInstr();
            if (labelInstr->isOpHelper)
            {
                if (lastOpHelperLabel == NULL)
                {
                    lastOpHelperLabel = labelInstr;
                    lastOpHelperStatementIndex = currentStatement ? currentStatement->m_statementIndex : Js::Constants::NoStatementIndex;
                    lastOpHelperFunc = currentStatement ? currentStatement->m_func : nullptr;
                }
            }
            else if (lastOpHelperLabel != NULL)
            {
                IR::Instr * prevInstr = lastOpHelperLabel->GetPrevRealInstrOrLabel();
                if (prevInstr->IsBranchInstr())
                {
                    // If the previous instruction is to jump around this helper block
                    // Then we move the helper block to the end of the function to
                    // avoid the jmp in the fast path.

                    //      jxx $label          <== prevInstr
                    // $helper:                 <== lastOpHelperLabel
                    //      ...
                    //      ...                 <== lastOpHelperInstr
                    // $label:                  <== labelInstr

                    IR::BranchInstr * prevBranchInstr = prevInstr->AsBranchInstr();
                    if (prevBranchInstr->GetTarget() == labelInstr)
                    {
                        lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);


                        if (prevBranchInstr->IsUnconditional())
                        {
                            // Remove the branch to next after the helper block is moved.
                            prevBranchInstr->Remove();
                        }
                        else
                        {
                            // Reverse the condition
                            LowererMD::InvertBranch(prevBranchInstr);
                            prevBranchInstr->SetTarget(lastOpHelperLabel);
                        }
                    }
                    else if (prevBranchInstr->IsUnconditional())
                    {
                        IR::Instr * prevPrevInstr = prevInstr->GetPrevRealInstrOrLabel();
                        if (prevPrevInstr->IsBranchInstr()
                            && prevPrevInstr->AsBranchInstr()->IsConditional()
                            && prevPrevInstr->AsBranchInstr()->GetTarget() == labelInstr)
                        {

                            //      jcc $label          <== prevPrevInstr
                            //      jmp $blah           <== prevInstr
                            // $helper:                 <== lastOpHelperLabel
                            //      ...
                            //      ...                 <== lastOpHelperInstr
                            // $label:                  <== labelInstr

                            // Transform to

                            //      jncc $blah          <== prevPrevInstr
                            // $label:                  <== labelInstr

                            // $helper:                 <== lastOpHelperLabel
                            //      ...
                            //      ...                 <== lastOpHelperInstr
                            //      jmp $label:         <== labelInstr

                            lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);

                            LowererMD::InvertBranch(prevPrevInstr->AsBranchInstr());
                            prevPrevInstr->AsBranchInstr()->SetTarget(prevBranchInstr->GetTarget());
                            prevBranchInstr->Remove();
                        }
                        else
                        {
                            IR::Instr *lastOpHelperInstr = labelInstr->GetPrevRealInstr();
                            if (lastOpHelperInstr->IsBranchInstr())
                            {
                                IR::BranchInstr *lastOpHelperBranchInstr = lastOpHelperInstr->AsBranchInstr();

                                //      jmp $target         <== prevInstr           //this is unconditional jump
                                // $helper:                 <== lastOpHelperLabel
                                //      ...
                                //      jmp $labeln         <== lastOpHelperInstr   //Conditional/Unconditional jump
                                // $label:                  <== labelInstr

                                lastInstr = this->MoveHelperBlock(lastOpHelperLabel, lastOpHelperStatementIndex, lastOpHelperFunc, labelInstr, lastInstr);
                                //Compensation code if its not unconditional jump
                                if (!lastOpHelperBranchInstr->IsUnconditional())
                                {
                                    IR::BranchInstr *branchInstr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelInstr, this->func);
                                    lastOpHelperBranchInstr->InsertAfter(branchInstr);
                                }
                            }

                        }
                    }
                }
                lastOpHelperLabel = NULL;
            }
        }
    }
    NEXT_INSTR_EDITING_IN_RANGE;

    func->m_tailInstr = lastInstr;
}